

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_tests.cpp
# Opt level: O2

void __thiscall skiwi::anon_unknown_0::cleanup(anon_unknown_0 *this,EVP_PKEY_CTX *ctx)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  istream *piVar4;
  pointer pcVar5;
  string *__it;
  long lVar6;
  size_type sVar7;
  _Alloc_hider _Var8;
  pointer local_208;
  pointer local_200;
  pointer local_1f8;
  pointer local_1f0;
  pointer local_1e8;
  pointer local_1e0;
  pointer local_1d8;
  string line;
  istringstream s;
  
  *(anon_unknown_0 **)this = this + 0x10;
  *(undefined8 *)(this + 8) = 0;
  this[0x10] = (anon_unknown_0)0x0;
  std::__cxx11::istringstream::istringstream((istringstream *)&s,(string *)ctx,_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  do {
    __it = &line;
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&s,(string *)&line);
    _Var2 = line._M_dataplus;
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
      if (*(long *)(this + 8) != 0) {
        std::__cxx11::string::pop_back();
      }
      std::__cxx11::string::~string((string *)&line);
      std::__cxx11::istringstream::~istringstream((istringstream *)&s);
      return;
    }
    pcVar1 = line._M_dataplus._M_p + line._M_string_length;
    sVar7 = line._M_string_length;
    for (lVar6 = (long)line._M_string_length >> 2; pcVar5 = _Var2._M_p + sVar7, _Var8._M_p = pcVar5,
        0 < lVar6; lVar6 = lVar6 + -1) {
      local_1d8 = pcVar5;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<skiwi::(anonymous_namespace)::cleanup(std::__cxx11::string)::$_0>::
              operator()((_Iter_pred<skiwi::(anonymous_namespace)::cleanup(std::__cxx11::string)::__0>
                          *)&local_1d8,
                         (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)__it);
      if (bVar3) goto LAB_001b0757;
      local_1e0 = _Var2._M_p + (sVar7 - 1);
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<skiwi::(anonymous_namespace)::cleanup(std::__cxx11::string)::$_0>::
              operator()((_Iter_pred<skiwi::(anonymous_namespace)::cleanup(std::__cxx11::string)::__0>
                          *)&local_1e0,
                         (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)__it);
      _Var8._M_p = _Var2._M_p + (sVar7 - 1);
      if (bVar3) goto LAB_001b0757;
      local_1e8 = _Var2._M_p + (sVar7 - 2);
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<skiwi::(anonymous_namespace)::cleanup(std::__cxx11::string)::$_0>::
              operator()((_Iter_pred<skiwi::(anonymous_namespace)::cleanup(std::__cxx11::string)::__0>
                          *)&local_1e8,
                         (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)__it);
      _Var8._M_p = _Var2._M_p + (sVar7 - 2);
      if (bVar3) goto LAB_001b0757;
      local_1f0 = _Var2._M_p + (sVar7 - 3);
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<skiwi::(anonymous_namespace)::cleanup(std::__cxx11::string)::$_0>::
              operator()((_Iter_pred<skiwi::(anonymous_namespace)::cleanup(std::__cxx11::string)::__0>
                          *)&local_1f0,
                         (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)__it);
      _Var8._M_p = _Var2._M_p + (sVar7 - 3);
      if (bVar3) goto LAB_001b0757;
      sVar7 = sVar7 - 4;
    }
    if (sVar7 == 3) {
      local_1f8 = pcVar5;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<skiwi::(anonymous_namespace)::cleanup(std::__cxx11::string)::$_0>::
              operator()((_Iter_pred<skiwi::(anonymous_namespace)::cleanup(std::__cxx11::string)::__0>
                          *)&local_1f8,
                         (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)__it);
      if (!bVar3) {
        pcVar5 = _Var2._M_p + 2;
        goto LAB_001b07bd;
      }
    }
    else {
      if (sVar7 == 2) {
LAB_001b07bd:
        local_200 = pcVar5;
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<skiwi::(anonymous_namespace)::cleanup(std::__cxx11::string)::$_0>::
                operator()((_Iter_pred<skiwi::(anonymous_namespace)::cleanup(std::__cxx11::string)::__0>
                            *)&local_200,
                           (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)__it);
        _Var8._M_p = pcVar5;
        if (bVar3) goto LAB_001b0757;
        pcVar5 = pcVar5 + -1;
      }
      else {
        _Var8 = _Var2;
        if (sVar7 != 1) goto LAB_001b0757;
      }
      local_208 = pcVar5;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<skiwi::(anonymous_namespace)::cleanup(std::__cxx11::string)::$_0>::
              operator()((_Iter_pred<skiwi::(anonymous_namespace)::cleanup(std::__cxx11::string)::__0>
                          *)&local_208,
                         (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)__it);
      _Var8 = _Var2;
      if (bVar3) {
        _Var8._M_p = pcVar5;
      }
    }
LAB_001b0757:
    std::__cxx11::string::erase(&line,_Var8._M_p,pcVar1);
    lVar6 = std::__cxx11::string::find_first_not_of((char)&line,0x20);
    if (lVar6 != -1) {
      std::__cxx11::string::append((string *)this);
      std::__cxx11::string::push_back((char)this);
    }
  } while( true );
}

Assistant:

std::string cleanup(std::string str)
    {
    std::string res;
    std::istringstream s(str);
    std::string line;
    while (std::getline(s, line))
      {
      line.erase(std::find_if(line.rbegin(), line.rend(), [](int ch)
        {
        return !std::isspace(ch);
        }).base(), line.end());
      auto pos = line.find_first_not_of(' ');
      if (pos != std::string::npos)
        {
        res.append(line);
        res.push_back('\n');
        }
      }
    if (!res.empty())
      res.pop_back(); // remove last newline char
    return res;
    }